

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitMul(EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,BinaryExpr e)

{
  EExpr er;
  EExpr el;
  EExpr local_3e48;
  PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
  local_3c88;
  
  if (this->prepro_products_ == 0) {
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit((EExpr *)&local_3c88,
            (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
             *)this,(Expr)((ExprBase *)
                          ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                 super_ExprBase.impl_ + 8))->impl_);
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit(&local_3e48,
            (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
             *)this,(Expr)((ExprBase *)
                          ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                 super_ExprBase.impl_ + 0x10))->impl_);
    QuadratizeOrLinearize(__return_storage_ptr__,this,(EExpr *)&local_3c88,&local_3e48);
    if (6 < local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_3e48.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < (ulong)local_3c88.terms_flt_.
                   super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                   .m_data.m_storage.m_data[0]._304_8_) {
      operator_delete((void *)local_3c88.terms_flt_.
                              super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                              .m_data.m_storage.m_data[0]._296_8_,
                      local_3c88.terms_flt_.
                      super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                      .m_data.m_storage.m_data[0]._304_8_ << 2);
    }
    if (6 < (ulong)local_3c88.terms_flt_.
                   super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                   .m_data.m_storage.m_data[0]._256_8_) {
      operator_delete((void *)local_3c88.terms_flt_.
                              super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                              .m_data.m_storage.m_data[0]._248_8_,
                      local_3c88.terms_flt_.
                      super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                      .m_data.m_storage.m_data[0]._256_8_ << 2);
    }
    if (6 < (ulong)local_3c88.terms_flt_.
                   super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                   .m_data.m_storage.m_data[0]._184_8_) {
      operator_delete((void *)local_3c88.terms_flt_.
                              super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                              .m_data.m_storage.m_data[0]._176_8_,
                      local_3c88.terms_flt_.
                      super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                      .m_data.m_storage.m_data[0]._184_8_ << 3);
    }
    if (8 < (ulong)local_3c88.terms_flt_.
                   super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                   .m_data.m_storage.m_data[0]._32_8_) {
      operator_delete((void *)local_3c88.terms_flt_.
                              super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                              .m_data.m_storage.m_data[0]._24_8_,
                      local_3c88.terms_flt_.
                      super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                      .m_data.m_storage.m_data[0]._32_8_ << 4);
    }
    if (6 < local_3c88.terms_flt_.
            super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
            .m_data.
            super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
            .m_capacity) {
      operator_delete(local_3c88.terms_flt_.
                      super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                      .m_data.
                      super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                      .m_data_ptr,
                      local_3c88.terms_flt_.
                      super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                      .m_data.
                      super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
                      .m_capacity << 2);
    }
    if ((_func_int **)0x6 <
        local_3c88.
        super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
        .factory_._vptr_BasicExprFactory) {
      operator_delete((void *)local_3c88.
                              super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                              .
                              super_ExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                              .
                              super_BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
                              ._vptr_BasicExprVisitor,
                      (long)local_3c88.
                            super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                            .factory_._vptr_BasicExprFactory << 3);
    }
  }
  else {
    local_3c88.terms_flt_.
    super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
    .m_data.
    super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
    .m_data_ptr = (ptr)&local_3c88.terms_flt_.
                        super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
                        .m_data.m_storage;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_005c22a8;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_.exprs_.
    super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_.exprs_.
    super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_.exprs_.
    super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_.funcs_.
    super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_.funcs_.
    super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .factory_.funcs_.
    super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .
    super_ExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .
    super_BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor =
         (BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
          )&PTR__PreproProd_005d2430;
    local_3c88.terms_flt_.
    super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
    .m_data.
    super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
    .m_capacity = 0x20;
    local_3c88.terms_flt_.
    super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
    .m_data.
    super_small_vector_data_base<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_*,_unsigned_long>
    .m_size = 0;
    local_3c88.n_terms_const_ = 0;
    local_3c88.n_terms_binary_ = 0;
    local_3c88.flt_ =
         (ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *)this;
    BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
    ::Visit((BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
             *)&local_3c88,
            (Expr)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_);
    PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
    ::SortTerms(&local_3c88);
    PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>
    ::CombineOrderedFactors(__return_storage_ptr__,&local_3c88);
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .
    super_ExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .
    super_BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor =
         (BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
          )&PTR__PreproProd_005d2430;
    gch::detail::
    small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
    ::wipe(&local_3c88.terms_flt_.
            super_small_vector_base<std::allocator<std::tuple<std::pair<int,_double>,_mp::EExpr,_std::pair<double,_double>_>_>,_32U>
          );
    local_3c88.
    super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .
    super_ExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
    .
    super_BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor =
         (BasicExprVisitor<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void,_mp::internal::ExprTypes>
          )&PTR__ExprConverter_005d24a8;
    BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
              (&local_3c88.
                super_ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
                .factory_);
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitMul(BinaryExpr e) {
    if (prepro_products()) {
      PreproProd<Impl> preprod(*(Impl*)this);
      return preprod.FlattenProduct(e);
    }
    auto el = Convert2EExpr(e.lhs());
    auto er = Convert2EExpr(e.rhs());
    return QuadratizeOrLinearize( el, er );
  }